

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlUTF8Size(xmlChar *utf)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if (utf != (xmlChar *)0x0) {
    bVar1 = *utf;
    if (-1 < (char)bVar1) {
      return 1;
    }
    if ((bVar1 & 0x40) != 0) {
      uVar3 = 0x20;
      iVar2 = 2;
      do {
        if ((uVar3 & bVar1) == 0) {
          return iVar2;
        }
        iVar2 = iVar2 + 1;
        uVar3 = uVar3 >> 1;
      } while (iVar2 != 8);
    }
  }
  return -1;
}

Assistant:

int
xmlUTF8Size(const xmlChar *utf) {
    xmlChar mask;
    int len;

    if (utf == NULL)
        return -1;
    if (*utf < 0x80)
        return 1;
    /* check valid UTF8 character */
    if (!(*utf & 0x40))
        return -1;
    /* determine number of bytes in char */
    len = 2;
    for (mask=0x20; mask != 0; mask>>=1) {
        if (!(*utf & mask))
            return len;
        len++;
    }
    return -1;
}